

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Federate.cpp
# Opt level: O0

void __thiscall helics::Federate::~Federate(Federate *this)

{
  Modes MVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  Federate *in_stack_000000f0;
  
  (in_RDI->_M_dataplus)._M_p = (pointer)&PTR__Federate_00924380;
  MVar1 = std::atomic::operator_cast_to_Modes((atomic<helics::Federate::Modes> *)0x21bd7a);
  if (MVar1 != FINALIZE) {
    finalize(in_stack_000000f0);
  }
  std::function<void_(int,_std::basic_string_view<char,_std::char_traits<char>_>)>::~function
            ((function<void_(int,_std::basic_string_view<char,_std::char_traits<char>_>)> *)0x21bdc0
            );
  CLI::std::function<void_()>::~function((function<void_()> *)0x21bdd1);
  CLI::std::function<void_()>::~function((function<void_()> *)0x21bde2);
  std::function<void_(bool)>::~function((function<void_(bool)> *)0x21bdf3);
  std::function<void_(TimeRepresentation<count_time<9,_long>_>,_bool)>::~function
            ((function<void_(TimeRepresentation<count_time<9,_long>_>,_bool)> *)0x21be04);
  std::function<void_(helics::Federate::Modes,_helics::Federate::Modes)>::~function
            ((function<void_(helics::Federate::Modes,_helics::Federate::Modes)> *)0x21be15);
  std::function<void_(TimeRepresentation<count_time<9,_long>_>,_bool)>::~function
            ((function<void_(TimeRepresentation<count_time<9,_long>_>,_bool)> *)0x21be26);
  std::
  function<void_(TimeRepresentation<count_time<9,_long>_>,_TimeRepresentation<count_time<9,_long>_>,_bool)>
  ::~function((function<void_(TimeRepresentation<count_time<9,_long>_>,_TimeRepresentation<count_time<9,_long>_>,_bool)>
               *)0x21be37);
  std::__cxx11::string::~string(in_RDI);
  std::
  unique_ptr<helics::PotentialInterfacesManager,_std::default_delete<helics::PotentialInterfacesManager>_>
  ::~unique_ptr((unique_ptr<helics::PotentialInterfacesManager,_std::default_delete<helics::PotentialInterfacesManager>_>
                 *)in_RDI);
  std::
  unique_ptr<helics::ConnectorFederateManager,_std::default_delete<helics::ConnectorFederateManager>_>
  ::~unique_ptr((unique_ptr<helics::ConnectorFederateManager,_std::default_delete<helics::ConnectorFederateManager>_>
                 *)in_RDI);
  std::
  unique_ptr<gmlc::libguarded::shared_guarded<helics::AsyncFedCallInfo,_std::mutex>,_std::default_delete<gmlc::libguarded::shared_guarded<helics::AsyncFedCallInfo,_std::mutex>_>_>
  ::~unique_ptr((unique_ptr<gmlc::libguarded::shared_guarded<helics::AsyncFedCallInfo,_std::mutex>,_std::default_delete<gmlc::libguarded::shared_guarded<helics::AsyncFedCallInfo,_std::mutex>_>_>
                 *)in_RDI);
  std::__cxx11::string::~string(in_RDI);
  std::shared_ptr<helics::Core>::~shared_ptr((shared_ptr<helics::Core> *)0x21be8b);
  return;
}

Assistant:

Federate::~Federate()
{
    if (currentMode != Modes::FINALIZE) {
        try {
            finalize();
        }
        // LCOV_EXCL_START
        catch (...)  // do not allow a throw inside the destructor
        {
            // finalize may throw but we can't allow that
            ;
        }
        // LCOV_EXCL_STOP
    }
}